

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O2

bin_mdef_t * bin_mdef_read_text(ps_config_t *config,char *filename)

{
  ph_rc_t **pppVar1;
  phone_t *ppVar2;
  ph_lc_t *ppVar3;
  int16 *piVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  mdef_t *m;
  bin_mdef_t *m_00;
  char **ppcVar8;
  size_t sVar9;
  mdef_entry_t *pmVar10;
  cd_tree_t *pcVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  ph_lc_s **pppVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ph_lc_t *ppVar20;
  undefined8 uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lStackY_50;
  
  m = mdef_init(filename,1);
  if (m == (mdef_t *)0x0) {
    return (bin_mdef_t *)0x0;
  }
  uVar13 = m->n_sen;
  if ((int)uVar13 < 0x10000) {
    uVar13 = m->n_sseq;
    if ((int)uVar13 < 0x10000) {
      uVar13 = m->n_ciphone;
      if ((int)uVar13 < 0x100) {
        lVar25 = 1;
        m_00 = (bin_mdef_t *)
               __ckd_calloc__(1,0x78,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                              ,0x5f);
        m_00->refcnt = 1;
        iVar24 = m->n_ciphone;
        iVar5 = m->n_phone;
        iVar6 = m->n_emit_state;
        iVar7 = m->n_ci_sen;
        m_00->n_ciphone = m->n_ciphone;
        m_00->n_phone = iVar5;
        m_00->n_emit_state = iVar6;
        m_00->n_ci_sen = iVar7;
        iVar5 = m->n_tmat;
        m_00->n_sen = m->n_sen;
        m_00->n_tmat = iVar5;
        m_00->n_sseq = m->n_sseq;
        m_00->sseq = m->sseq;
        piVar4 = m->sen2cimap;
        m_00->cd2cisen = m->cd2cisen;
        m_00->sen2cimap = piVar4;
        m_00->n_ctx = 3;
        m_00->sil = (int)m->sil;
        m->sseq = (uint16 **)0x0;
        m->cd2cisen = (int16 *)0x0;
        m->sen2cimap = (int16 *)0x0;
        lVar22 = 8;
        ppcVar8 = (char **)__ckd_calloc__((long)iVar24,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                          ,0x76);
        m_00->ciname = ppcVar8;
        uVar16 = 0;
        uVar17 = (ulong)(uint)m_00->n_ciphone;
        if (m_00->n_ciphone < 1) {
          uVar17 = uVar16;
        }
        iVar24 = 0;
        for (; uVar17 << 4 != uVar16; uVar16 = uVar16 + 0x10) {
          sVar9 = strlen(*(char **)((long)&m->ciphone->name + uVar16));
          iVar24 = iVar24 + (int)sVar9 + 1;
        }
        pcVar12 = (char *)__ckd_calloc__((long)iVar24,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                         ,0x7a);
        *m_00->ciname = pcVar12;
        strcpy(*m_00->ciname,m->ciphone->name);
        do {
          if (m_00->n_ciphone <= lVar25) {
            pmVar10 = (mdef_entry_t *)
                      __ckd_calloc__((long)m_00->n_phone,0xc,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                     ,0x8b);
            m_00->phone = pmVar10;
            lVar25 = 8;
            lVar22 = 0;
            lVar14 = 0;
            for (lVar18 = 0; lVar18 < m->n_phone; lVar18 = lVar18 + 1) {
              ppVar2 = m->phone;
              pmVar10 = m_00->phone;
              *(undefined8 *)((long)&pmVar10->ssid + lVar14) =
                   *(undefined8 *)((long)&ppVar2->ssid + lVar22);
              if (lVar18 < m_00->n_ciphone) {
                *(undefined1 *)((long)&pmVar10->info + lVar14) =
                     *(undefined1 *)((long)&m->ciphone->name + lVar25);
              }
              else {
                *(undefined1 *)((long)&pmVar10->info + lVar14) =
                     *(undefined1 *)((long)&ppVar2->wpos + lVar22);
                *(undefined1 *)((long)&m_00->phone->info + lVar14 + 1) =
                     *(undefined1 *)((long)&m->phone->ci + lVar22);
                *(undefined1 *)((long)&m_00->phone->info + lVar14 + 2) =
                     *(undefined1 *)((long)&m->phone->lc + lVar22);
                *(undefined1 *)((long)&m_00->phone->info + lVar14 + 3) =
                     *(undefined1 *)((long)&m->phone->rc + lVar22);
              }
              lVar14 = lVar14 + 0xc;
              lVar22 = lVar22 + 0x14;
              lVar25 = lVar25 + 0x10;
            }
            uVar16 = 0;
            uVar17 = (ulong)(uint)m->n_ciphone;
            if (m->n_ciphone < 1) {
              uVar17 = uVar16;
            }
            uVar13 = 0;
            uVar23 = 0;
            for (; uVar16 != 4; uVar16 = uVar16 + 1) {
              for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
                pppVar15 = m->wpos_ci_lclist[uVar16] + uVar19;
                while( true ) {
                  ppVar3 = *pppVar15;
                  ppVar20 = ppVar3;
                  if (ppVar3 == (ph_lc_t *)0x0) break;
                  do {
                    pppVar1 = &ppVar20->rclist;
                    uVar13 = uVar13 + 1;
                    ppVar20 = (ph_lc_t *)*pppVar1;
                  } while ((ph_lc_t *)*pppVar1 != (ph_lc_t *)0x0);
                  uVar23 = (ulong)((int)uVar23 + 1);
                  pppVar15 = &ppVar3->next;
                }
                uVar13 = uVar13 + 1;
                uVar23 = (ulong)((int)uVar23 + 1);
              }
              uVar13 = uVar13 + 1;
              uVar23 = (ulong)((int)uVar23 + 1);
            }
            uVar17 = (ulong)((int)uVar17 * 4 + 4);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                    ,0xb5,"Allocating %d * %d bytes (%d KiB) for CD tree\n",(ulong)uVar13,8,
                    (ulong)(long)(int)uVar13 >> 7 & 0x3fffffffffffff);
            m_00->n_cd_tree = uVar13;
            pcVar11 = (cd_tree_t *)
                      __ckd_calloc__((long)(int)uVar13,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                     ,0xb7);
            m_00->cd_tree = pcVar11;
            lVar25 = 4;
            for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
              pcVar11 = m_00->cd_tree;
              pcVar11[lVar22].ctx = (int16)lVar22;
              pcVar11[lVar22].n_down = (int16)m->n_ciphone;
              pcVar11[lVar22].c.pid = (int)lVar25;
              lVar25 = (long)(int)lVar25;
              for (lVar14 = 0; lVar14 < m->n_ciphone; lVar14 = lVar14 + 1) {
                pcVar11 = m_00->cd_tree;
                pcVar11[lVar25].ctx = (int16)lVar14;
                pcVar11[lVar25].c.pid = (int)uVar17;
                pppVar15 = m->wpos_ci_lclist[lVar22] + lVar14;
                uVar17 = (ulong)(int)uVar17;
                while( true ) {
                  ppVar3 = *pppVar15;
                  pcVar11 = m_00->cd_tree;
                  if (ppVar3 == (ph_lc_t *)0x0) break;
                  pcVar11[uVar17].ctx = ppVar3->lc;
                  pcVar11[uVar17].c.pid = (int)uVar23;
                  uVar23 = (ulong)(int)uVar23;
                  ppVar20 = ppVar3;
                  while( true ) {
                    ppVar20 = (ph_lc_t *)ppVar20->rclist;
                    pcVar11 = m_00->cd_tree;
                    if (ppVar20 == (ph_lc_t *)0x0) break;
                    pcVar11[uVar23].ctx = ppVar20->lc;
                    pcVar11[uVar23].n_down = 0;
                    pcVar11[uVar23].c = *(anon_union_4_2_61eccf2c_for_c *)&ppVar20->field_0x4;
                    piVar4 = &m_00->cd_tree[uVar17].n_down;
                    *piVar4 = *piVar4 + 1;
                    uVar23 = uVar23 + 1;
                  }
                  if (pcVar11[uVar17].n_down == 0) {
                    pcVar11[uVar17].c.pid = -1;
                    pcVar11 = m_00->cd_tree;
                  }
                  pcVar11[lVar25].n_down = pcVar11[lVar25].n_down + 1;
                  uVar17 = uVar17 + 1;
                  pppVar15 = &ppVar3->next;
                }
                if (pcVar11[lVar25].n_down == 0) {
                  pcVar11[lVar25].c.pid = -1;
                }
                lVar25 = lVar25 + 1;
              }
            }
            mdef_free(m);
            m_00->alloc_mode = BIN_MDEF_FROM_TEXT;
            return m_00;
          }
          ppcVar8 = m_00->ciname;
          pcVar12 = *(char **)((long)ppcVar8 + lVar22 + -8);
          sVar9 = strlen(pcVar12);
          *(char **)((long)ppcVar8 + lVar22) = pcVar12 + sVar9 + 1;
          strcpy(*(char **)((long)m_00->ciname + lVar22),
                 *(char **)((long)&m->ciphone->name + lVar22 * 2));
          iVar24 = strcmp(*(char **)((long)m_00->ciname + lVar22 + -8),
                          *(char **)((long)m_00->ciname + lVar22));
          lVar25 = lVar25 + 1;
          lVar22 = lVar22 + 8;
        } while (iVar24 < 1);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0x83,"Phone names are not in sorted order, sorry.");
        bin_mdef_free(m_00);
        mdef_free(m);
        return (bin_mdef_t *)0x0;
      }
      pcVar12 = "Number of phones exceeds limit: %d > %d\n";
      lStackY_50 = 0x5a;
      uVar21 = 0xff;
      goto LAB_0011c398;
    }
    pcVar12 = "Number of senone sequences exceeds limit: %d > %d\n";
    lStackY_50 = 0x53;
  }
  else {
    pcVar12 = "Number of senones exceeds limit: %d > %d\n";
    lStackY_50 = 0x4d;
  }
  uVar21 = 0xffff;
LAB_0011c398:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,lStackY_50,pcVar12,(ulong)uVar13,uVar21);
  mdef_free(m);
  return (bin_mdef_t *)0x0;
}

Assistant:

bin_mdef_t *
bin_mdef_read_text(ps_config_t *config, const char *filename)
{
    bin_mdef_t *bmdef;
    mdef_t *mdef;
    int i, nodes, ci_idx, lc_idx, rc_idx;
    int nchars;

    (void)config;

    if ((mdef = mdef_init((char *) filename, TRUE)) == NULL)
        return NULL;

    /* Enforce some limits.  */
    if (mdef->n_sen > BAD_SENID) {
        E_ERROR("Number of senones exceeds limit: %d > %d\n",
                mdef->n_sen, BAD_SENID);
        mdef_free(mdef);
        return NULL;
    }
    if (mdef->n_sseq > BAD_SSID) {
        E_ERROR("Number of senone sequences exceeds limit: %d > %d\n",
                mdef->n_sseq, BAD_SSID);
        mdef_free(mdef);
        return NULL;
    }
    /* We use uint8 for ciphones */
    if (mdef->n_ciphone > 255) {
        E_ERROR("Number of phones exceeds limit: %d > %d\n",
                mdef->n_ciphone, 255);
        mdef_free(mdef);
        return NULL;
    }

    bmdef = ckd_calloc(1, sizeof(*bmdef));
    bmdef->refcnt = 1;

    /* Easy stuff.  The mdef.c code has done the heavy lifting for us. */
    bmdef->n_ciphone = mdef->n_ciphone;
    bmdef->n_phone = mdef->n_phone;
    bmdef->n_emit_state = mdef->n_emit_state;
    bmdef->n_ci_sen = mdef->n_ci_sen;
    bmdef->n_sen = mdef->n_sen;
    bmdef->n_tmat = mdef->n_tmat;
    bmdef->n_sseq = mdef->n_sseq;
    bmdef->sseq = mdef->sseq;
    bmdef->cd2cisen = mdef->cd2cisen;
    bmdef->sen2cimap = mdef->sen2cimap;
    bmdef->n_ctx = 3;           /* Triphones only. */
    bmdef->sil = mdef->sil;
    mdef->sseq = NULL;          /* We are taking over this one. */
    mdef->cd2cisen = NULL;      /* And this one. */
    mdef->sen2cimap = NULL;     /* And this one. */

    /* Get the phone names.  If they are not sorted
     * ASCII-betically then we are in a world of hurt and
     * therefore will simply refuse to continue. */
    bmdef->ciname = ckd_calloc(bmdef->n_ciphone, sizeof(*bmdef->ciname));
    nchars = 0;
    for (i = 0; i < bmdef->n_ciphone; ++i)
        nchars += strlen(mdef->ciphone[i].name) + 1;
    bmdef->ciname[0] = ckd_calloc(nchars, 1);
    strcpy(bmdef->ciname[0], mdef->ciphone[0].name);
    for (i = 1; i < bmdef->n_ciphone; ++i) {
        assert(i > 0); /* No reason to imagine it wouldn't be, but... */
        bmdef->ciname[i] =
            bmdef->ciname[i - 1] + strlen(bmdef->ciname[i - 1]) + 1;
        strcpy(bmdef->ciname[i], mdef->ciphone[i].name);
        if (strcmp(bmdef->ciname[i - 1], bmdef->ciname[i]) > 0) {
            /* FIXME: there should be a solution to this, actually. */
            E_ERROR("Phone names are not in sorted order, sorry.");
            bin_mdef_free(bmdef);
            mdef_free(mdef);
            return NULL;
        }
    }

    /* Copy over phone information. */
    bmdef->phone = ckd_calloc(bmdef->n_phone, sizeof(*bmdef->phone));
    for (i = 0; i < mdef->n_phone; ++i) {
        bmdef->phone[i].ssid = mdef->phone[i].ssid;
        bmdef->phone[i].tmat = mdef->phone[i].tmat;
        if (i < bmdef->n_ciphone) {
            bmdef->phone[i].info.ci.filler = mdef->ciphone[i].filler;
        }
        else {
            bmdef->phone[i].info.cd.wpos = mdef->phone[i].wpos;
            bmdef->phone[i].info.cd.ctx[0] = mdef->phone[i].ci;
            bmdef->phone[i].info.cd.ctx[1] = mdef->phone[i].lc;
            bmdef->phone[i].info.cd.ctx[2] = mdef->phone[i].rc;
        }
    }

    /* Walk the wpos_ci_lclist once to find the total number of
     * nodes and the starting locations for each level. */
    nodes = lc_idx = ci_idx = rc_idx = 0;
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    ++nodes;    /* RC node */
                }
                ++nodes;        /* LC node */
                ++rc_idx;       /* Start of RC nodes (after LC nodes) */
            }
            ++nodes;            /* CI node */
            ++lc_idx;           /* Start of LC nodes (after CI nodes) */
            ++rc_idx;           /* Start of RC nodes (after CI and LC nodes) */
        }
        ++nodes;                /* wpos node */
        ++ci_idx;               /* Start of CI nodes (after wpos nodes) */
        ++lc_idx;               /* Start of LC nodes (after CI nodes) */
        ++rc_idx;               /* STart of RC nodes (after wpos, CI, and LC nodes) */
    }
    E_INFO("Allocating %d * %d bytes (%d KiB) for CD tree\n",
           nodes, sizeof(*bmdef->cd_tree), 
           nodes * sizeof(*bmdef->cd_tree) / 1024);
    bmdef->n_cd_tree = nodes;
    bmdef->cd_tree = ckd_calloc(nodes, sizeof(*bmdef->cd_tree));
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;

        bmdef->cd_tree[i].ctx = i;
        bmdef->cd_tree[i].n_down = mdef->n_ciphone;
        bmdef->cd_tree[i].c.down = ci_idx;
#if 0
        E_INFO("%d => %c (%d@%d)\n",
               i, (WPOS_NAME)[i],
               bmdef->cd_tree[i].n_down, bmdef->cd_tree[i].c.down);
#endif

        /* Now we can build the rest of the tree. */
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            bmdef->cd_tree[ci_idx].ctx = j;
            bmdef->cd_tree[ci_idx].c.down = lc_idx;
            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;

                bmdef->cd_tree[lc_idx].ctx = lc->lc;
                bmdef->cd_tree[lc_idx].c.down = rc_idx;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    bmdef->cd_tree[rc_idx].ctx = rc->rc;
                    bmdef->cd_tree[rc_idx].n_down = 0;
                    bmdef->cd_tree[rc_idx].c.pid = rc->pid;
#if 0
                    E_INFO("%d => %s %s %s %c (%d@%d)\n",
                           rc_idx,
                           bmdef->ciname[j],
                           bmdef->ciname[lc->lc],
                           bmdef->ciname[rc->rc],
                           (WPOS_NAME)[i],
                           bmdef->cd_tree[rc_idx].n_down,
                           bmdef->cd_tree[rc_idx].c.down);
#endif

                    ++bmdef->cd_tree[lc_idx].n_down;
                    ++rc_idx;
                }
                /* If there are no triphones here,
                 * this is considered a leafnode, so
                 * set the pid to -1. */
                if (bmdef->cd_tree[lc_idx].n_down == 0)
                    bmdef->cd_tree[lc_idx].c.pid = -1;
#if 0
                E_INFO("%d => %s %s %c (%d@%d)\n",
                       lc_idx,
                       bmdef->ciname[j],
                       bmdef->ciname[lc->lc],
                       (WPOS_NAME)[i],
                       bmdef->cd_tree[lc_idx].n_down,
                       bmdef->cd_tree[lc_idx].c.down);
#endif

                ++bmdef->cd_tree[ci_idx].n_down;
                ++lc_idx;
            }

            /* As above, so below. */
            if (bmdef->cd_tree[ci_idx].n_down == 0)
                bmdef->cd_tree[ci_idx].c.pid = -1;
#if 0
            E_INFO("%d => %d=%s (%d@%d)\n",
                   ci_idx, j, bmdef->ciname[j],
                   bmdef->cd_tree[ci_idx].n_down,
                   bmdef->cd_tree[ci_idx].c.down);
#endif

            ++ci_idx;
        }
    }

    mdef_free(mdef);

    bmdef->alloc_mode = BIN_MDEF_FROM_TEXT;
    return bmdef;
}